

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

void __thiscall
Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<-24>,Detail::M3<30>,Detail::M3<-10>,Detail::M2<-26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<_24>,Detail::M3<30>,Detail::M3<_10>,Detail::M2<_26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  bool bVar1;
  uint *puVar2;
  invalid_argument *this_00;
  long lVar3;
  
  *(undefined8 *)(this + 0x15c0) = 0;
  puVar2 = *first;
  if (puVar2 == last) {
    bVar1 = true;
  }
  else {
    lVar3 = 0;
    do {
      *(uint *)(this + lVar3 * 4) = *puVar2;
      puVar2 = puVar2 + 1;
      bVar1 = lVar3 != 0x56e;
      if (lVar3 == 0x56e) break;
      lVar3 = lVar3 + 1;
    } while (puVar2 != last);
    *first = puVar2;
  }
  if ((bVar1) && (*first == last)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }